

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateFastCmTypeOf
          (Lowerer *this,Instr *compare,RegOpnd *object,IntConstOpnd *typeIdOpnd,Instr *typeOf,
          bool *pfNoLower,bool isNeqOp)

{
  TypeId typeIdToCheck;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint32 offset;
  BailOutKind BVar6;
  LabelInstr *done;
  LabelInstr *target;
  LabelInstr *target_00;
  undefined4 *puVar7;
  RegOpnd *typeOpnd;
  RegOpnd *dst;
  undefined4 extraout_var;
  AddrOpnd *pAVar8;
  LabelInstr *pLVar9;
  IndirOpnd *pIVar10;
  Lowerer *dst_00;
  undefined4 extraout_var_00;
  IntConstOpnd *pIVar11;
  BailOutInfo *bailoutInfo;
  Opnd *this_00;
  undefined4 extraout_var_01;
  OpCode OVar12;
  LabelInstr *labelTarget;
  Lowerer *pLVar13;
  
  uVar4 = compare->m_opcode - 0x3b;
  if ((7 < uVar4) || ((0xe1U >> (uVar4 & 0x1f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x62fc,
                       "(compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar3) goto LAB_005f0c35;
    *puVar7 = 0;
  }
  typeIdToCheck = (TypeId)(typeIdOpnd->super_EncodableOpnd<long>).m_value;
  this_00 = (Opnd *)0x0;
  done = IR::LabelInstr::New(Label,this->m_func,false);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  target_00 = IR::LabelInstr::New(Label,this->m_func,true);
  OVar2 = IR::Opnd::GetKind(compare->m_dst);
  if (OVar2 == OpndKindReg) {
    this_00 = compare->m_dst;
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005f0c35;
      *puVar7 = 0;
    }
  }
  typeOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6305,"(dst)","dst");
    if (!bVar3) goto LAB_005f0c35;
    *puVar7 = 0;
  }
  bVar3 = IR::Opnd::IsEqual(this_00,&object->super_Opnd);
  if (bVar3) {
    dst = IR::RegOpnd::New((object->super_Opnd).m_type,this->m_func);
    InsertMove(&dst->super_Opnd,&object->super_Opnd,compare,true);
    object = dst;
  }
  iVar5 = (*compare->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
  pAVar8 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar5),AddrOpndKindDynamicVar,compare->m_func,
                             true,(Var)0x0);
  InsertMove(this_00,&pAVar8->super_Opnd,compare,true);
  pLVar9 = done;
  if (typeIdToCheck == TypeIds_Number) {
    pLVar9 = target;
  }
  labelTarget = target;
  if (pLVar9 == target) {
    labelTarget = done;
  }
  if (!isNeqOp) {
    labelTarget = pLVar9;
  }
  LowererMD::GenerateObjectTest(&this->m_lowererMD,&object->super_Opnd,compare,labelTarget,false);
  pIVar10 = IR::IndirOpnd::New(object,8,TyInt64,this->m_func,false);
  InsertMove(&typeOpnd->super_Opnd,&pIVar10->super_Opnd,compare,true);
  GenerateFalsyObjectTest(this,compare,typeOpnd,typeIdToCheck,target,done,isNeqOp);
  dst_00 = (Lowerer *)IR::RegOpnd::New(TyInt32,this->m_func);
  offset = Js::Type::GetOffsetOfTypeId();
  pIVar10 = IR::IndirOpnd::New(typeOpnd,offset,TyInt32,this->m_func,false);
  pLVar13 = dst_00;
  InsertMove((Opnd *)dst_00,&pIVar10->super_Opnd,compare,true);
  pLVar9 = done;
  if (typeIdToCheck == TypeIds_Object) {
    if (!isNeqOp) {
      pLVar9 = target;
    }
    OVar12 = BrGe_A;
LAB_005f0881:
    InsertCompareBranch(pLVar13,(Opnd *)dst_00,&typeIdOpnd->super_Opnd,OVar12,false,pLVar9,compare,
                        false);
  }
  else {
    if (typeIdToCheck == TypeIds_Function) {
      if (!isNeqOp) {
        pLVar9 = target;
      }
      OVar12 = BrEq_A;
      goto LAB_005f0881;
    }
    if (typeIdToCheck == TypeIds_Number) {
      pLVar13 = (Lowerer *)0x6;
      pIVar11 = IR::IntConstOpnd::New(6,TyInt32,compare->m_func,false);
      pLVar9 = target;
      if (!isNeqOp) {
        pLVar9 = done;
      }
      InsertCompareBranch(pLVar13,(Opnd *)dst_00,&pIVar11->super_Opnd,BrGt_A,false,pLVar9,compare,
                          false);
      pLVar13 = (Lowerer *)0x3;
      typeIdOpnd = IR::IntConstOpnd::New(3,TyInt32,compare->m_func,false);
      OVar12 = (ushort)isNeqOp * 2 + BrGe_A;
    }
    else {
      OVar12 = isNeqOp | BrEq_A;
    }
    InsertCompareBranch(pLVar13,(Opnd *)dst_00,&typeIdOpnd->super_Opnd,OVar12,false,target,compare,
                        false);
  }
  if (typeIdToCheck == TypeIds_Object) {
    iVar5 = (**compare->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo)();
    pLVar13 = (Lowerer *)CONCAT44(extraout_var_00,iVar5);
    pAVar8 = IR::AddrOpnd::New((intptr_t)pLVar13,AddrOpndKindDynamicVar,compare->m_func,true,
                               (Var)0x0);
    pLVar9 = done;
    if (!isNeqOp) {
      pLVar9 = target;
    }
    InsertCompareBranch(pLVar13,&object->super_Opnd,&pAVar8->super_Opnd,BrEq_A,false,pLVar9,compare,
                        false);
  }
  IR::Instr::InsertAfter(compare,&target->super_Instr);
  if (typeIdToCheck - TypeIds_Function < 2) {
    pLVar13 = (Lowerer *)0x1a;
    pIVar11 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar13,(Opnd *)dst_00,&pIVar11->super_Opnd,BrEq_A,false,target_00,compare,
                        false);
    pLVar13 = (Lowerer *)0x17;
    pIVar11 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
    pLVar9 = target;
    if (!isNeqOp) {
      pLVar9 = done;
    }
    InsertCompareBranch(pLVar13,(Opnd *)dst_00,&pIVar11->super_Opnd,BrNeq_A,false,pLVar9,compare,
                        false);
    IR::Instr::InsertBefore(compare,&target_00->super_Instr);
    IR::Instr::Unlink(typeOf);
    IR::Instr::InsertBefore(compare,typeOf);
    if ((((compare->field_0x38 & 0x10) != 0) &&
        (BVar6 = IR::Instr::GetBailOutKind(compare),
        (BVar6 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) &&
       (((typeOf->field_0x38 & 0x10) == 0 ||
        (BVar6 = IR::Instr::GetBailOutKind(typeOf),
        (BVar6 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls)))) {
      bailoutInfo = IR::Instr::GetBailOutInfo(compare);
      BVar6 = IR::Instr::GetBailOutKind(compare);
      typeOf = AddBailoutToHelperCallInstr(this,typeOf,bailoutInfo,BVar6,compare);
    }
    LoadScriptContext(this,typeOf);
    LowerUnaryHelper(this,typeOf,HelperOp_Typeof,(Opnd *)0x0);
    InsertBranch(Br,false,target,&target->super_Instr);
  }
  else {
    IR::Instr::Remove(typeOf);
    this_00 = IR::Instr::UnlinkDst(compare);
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_005f0c35:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    IR::Instr::Remove(compare);
    *pfNoLower = true;
  }
  IR::Instr::InsertBefore(&target->super_Instr,&done->super_Instr);
  iVar5 = (*((target->super_Instr).m_func)->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
  pAVar8 = IR::AddrOpnd::New(CONCAT44(extraout_var_01,iVar5),AddrOpndKindDynamicVar,
                             (target->super_Instr).m_func,true,(Var)0x0);
  InsertMove(this_00,&pAVar8->super_Opnd,&target->super_Instr,true);
  return;
}

Assistant:

void
Lowerer::GenerateFastCmTypeOf(IR::Instr *compare, IR::RegOpnd *object, IR::IntConstOpnd *typeIdOpnd, IR::Instr *typeOf, bool *pfNoLower, bool isNeqOp)
{
    Assert(compare->m_opcode == Js::OpCode::CmSrEq_A  ||
           compare->m_opcode == Js::OpCode::CmEq_A    ||
           compare->m_opcode == Js::OpCode::CmSrNeq_A ||
           compare->m_opcode == Js::OpCode::CmNeq_A);

    Js::TypeId      typeId   = static_cast<Js::TypeId>(typeIdOpnd->GetValue());
    IR::LabelInstr *movFalse = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *done = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *helper= IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::RegOpnd    *dst      = compare->GetDst()->IsRegOpnd() ? compare->GetDst()->AsRegOpnd() : nullptr;
    IR::RegOpnd    *typeRegOpnd  = IR::RegOpnd::New(TyMachReg, m_func);

    Assert(dst);

    if (dst->IsEqual(object))
    {
        //dst same as the src of typeof. As we need to move true to dst first we need to save the src to a new opnd
        IR::RegOpnd *newObject = IR::RegOpnd::New(object->GetType(), m_func);
        InsertMove(newObject, object, compare); //Save src
        object = newObject;
    }

    // mov dst, 'true'
    InsertMove(dst,
               LoadLibraryValueOpnd(compare, LibraryValue::ValueTrue),
               compare);

    // TEST object, 1
    // JNE (typeId == Js::TypeIds_Number) ? $done : $movFalse
    IR::LabelInstr *target = (typeId == Js::TypeIds_Number) ? done : movFalse;
    if (isNeqOp)
    {
        target = (target == done) ? movFalse : done;
    }

    m_lowererMD.GenerateObjectTest(object, compare, target);

    // MOV typeRegOpnd, [object + offset(Type)]
    InsertMove(typeRegOpnd,
               IR::IndirOpnd::New(object, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
               compare);

    GenerateFalsyObjectTest(compare, typeRegOpnd, typeId, done, movFalse, isNeqOp);

    // MOV objTypeId, [typeRegOpnd + offset(TypeId)]
    IR::RegOpnd* objTypeIdOpnd = IR::RegOpnd::New(TyInt32, m_func);
    InsertMove(objTypeIdOpnd,
               IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func),
               compare);

    // CMP objTypeId, typeId
    // JEQ/JGE $done
    if (typeId == Js::TypeIds_Object)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrGe_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Function)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrEq_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Number)
    {
        //Check for the typeIds between  TypeIds_FirstNumberType <= typeIds <= TypeIds_LastNumberType
        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_LastNumberType, TyInt32, compare->m_func),
                                Js::OpCode::BrGt_A,
                                isNeqOp ? done : movFalse,
                                compare);

        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_FirstNumberType, TyInt32, compare->m_func),
                                isNeqOp? Js::OpCode::BrLt_A : Js::OpCode::BrGe_A,
                                done,
                                compare);
    }
    else
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, done, compare);
    }

    // This could be 'null' which, for historical reasons, has a TypeId < TypeIds_Object but
    // is still a Javascript "object."
    if (typeId == Js::TypeIds_Object)
    {
        // CMP object, 0xXXXXXXXX
        // JEQ isNeqOp ? $movFalse : $done
        InsertCompareBranch(object,
                            LoadLibraryValueOpnd(compare, LibraryValue::ValueNull),
                            Js::OpCode::BrEq_A,
                            isNeqOp ? movFalse : done,
                            compare);
    }

    compare->InsertAfter(done); // Get this label first

    // "object" or "function" may come from HostDispatch. Needs helper if that's the case.
    if (typeId == Js::TypeIds_Object || typeId == Js::TypeIds_Function)
    {
        // CMP objTypeId, TypeIds_Proxy
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
            IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
            Js::OpCode::BrEq_A,
            helper,
            compare);

        // CMP objTypeId, TypeIds_HostDispatch
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
                            IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
                            Js::OpCode::BrNeq_A,
                            isNeqOp ? done : movFalse,
                            compare);

        // Now emit Typeof like we would've for the helper call.
        {
            compare->InsertBefore(helper);
            typeOf->Unlink();
            compare->InsertBefore(typeOf);
            if (compare->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(compare->GetBailOutKind()) &&
                (!typeOf->HasBailOutInfo() || !BailOutInfo::IsBailOutOnImplicitCalls(typeOf->GetBailOutKind())))
            {
                typeOf = AddBailoutToHelperCallInstr(typeOf, compare->GetBailOutInfo(), compare->GetBailOutKind(), compare);
            }
            LowerUnaryHelperMem(typeOf, IR::HelperOp_Typeof);
        }

        // JMP/B $done
        InsertBranch(Js::OpCode::Br, done, done);
    }
    else // Other primitive types don't need helper
    {
        typeOf->Remove();
        dst = compare->UnlinkDst()->AsRegOpnd();
        compare->Remove();
        *pfNoLower = true;
    }

    // $movFalse: (insert before $done)
    done->InsertBefore(movFalse);

    // MOV dst, 'false'
    InsertMove(dst, LoadLibraryValueOpnd(done, LibraryValue::ValueFalse), done);

    // $done:
}